

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimBitPacking(Gia_Man_t *p,Vec_Int_t *vCexStore,int nCexes,int nUnDecs)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *vAddOn;
  Vec_Wrd_t *p_00;
  int *pLits;
  Vec_Wrd_t *pVVar3;
  uint iPat;
  int nWords;
  int iVar4;
  uint nWordsUse;
  int iVar5;
  int i;
  bool bVar6;
  
  nWords = ((nCexes >> 6) + 1) - (uint)((nCexes & 0x3fU) == 0);
  vAddOn = Vec_WrdStartRandom(p->vCis->nSize * nWords);
  p_00 = Vec_WrdStart(p->vCis->nSize * nWords);
  iVar5 = nUnDecs + nCexes;
  iPat = 0;
  iVar4 = 0;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  i = 0;
  while( true ) {
    do {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) {
        if (i == vCexStore->nSize) {
          nWordsUse = (((int)(iPat + 1) >> 6) + 1) - (uint)((iPat + 1 & 0x3f) == 0);
          pVVar3 = Gia_ManSimCombine(p->vCis->nSize,p->vSimsPi,vAddOn,nWordsUse);
          printf("Compressed %d CEXes into %d patterns and added %d words to available %d words.\n",
                 (ulong)(uint)nCexes,(ulong)iPat,(ulong)nWordsUse,
                 (long)p->vSimsPi->nSize / (long)p->vCis->nSize & 0xffffffff);
          Vec_WrdFree(vAddOn);
          Vec_WrdFree(p_00);
          return pVVar3;
        }
        __assert_fail("iCur == Vec_IntSize(vCexStore)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x146,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
      }
      iVar1 = i + 1;
      Vec_IntEntry(vCexStore,i);
      i = i + 2;
      iVar1 = Vec_IntEntry(vCexStore,iVar1);
    } while (iVar1 == -1);
    pLits = Vec_IntEntryP(vCexStore,i);
    iVar2 = Gia_ManSimBitPackOne(nWords,vAddOn,p_00,iPat,pLits,iVar1);
    iPat = iVar2 + iPat;
    if (iVar5 < (int)iPat) break;
    i = iVar1 + i;
  }
  __assert_fail("iPat <= nCexes + nUnDecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x143,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimBitPacking( Gia_Man_t * p, Vec_Int_t * vCexStore, int nCexes, int nUnDecs )
{
    int c, iCur = 0, iPat = 0;
    int nWordsMax = Abc_Bit6WordNum( nCexes ); 
    Vec_Wrd_t * vSimsIn   = Vec_WrdStartRandom( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsCare = Vec_WrdStart( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsRes  = NULL;
    for ( c = 0; c < nCexes + nUnDecs; c++ )
    {
        int Out  = Vec_IntEntry( vCexStore, iCur++ );
        int Size = Vec_IntEntry( vCexStore, iCur++ );
        if ( Size == -1 )
            continue;
        iPat += Gia_ManSimBitPackOne( nWordsMax, vSimsIn, vSimsCare, iPat, Vec_IntEntryP(vCexStore, iCur), Size );
        iCur += Size;
        assert( iPat <= nCexes + nUnDecs );
        Out = 0;
    }
    assert( iCur == Vec_IntSize(vCexStore) );
    vSimsRes = Gia_ManSimCombine( Gia_ManCiNum(p), p->vSimsPi, vSimsIn, Abc_Bit6WordNum(iPat+1) );
    printf( "Compressed %d CEXes into %d patterns and added %d words to available %d words.\n", 
        nCexes, iPat, Abc_Bit6WordNum(iPat+1), Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p) );
    Vec_WrdFree( vSimsIn );
    Vec_WrdFree( vSimsCare );
    return vSimsRes;
}